

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

int __thiscall crnlib::dynamic_string::find_left(dynamic_string *this,char *p,bool case_sensitive)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  long lVar4;
  code *pcVar5;
  int iVar6;
  
  sVar3 = strlen(p);
  if ((int)CONCAT71(in_register_00000011,case_sensitive) == 0) {
    pcVar5 = strncasecmp;
  }
  else {
    pcVar5 = strncmp;
  }
  iVar6 = (int)sVar3;
  if (iVar6 <= (int)(uint)this->m_len) {
    lVar4 = 0;
    do {
      iVar2 = (*pcVar5)(p,this->m_pStr + lVar4,(long)iVar6);
      if (iVar2 == 0) {
        return (int)lVar4;
      }
      bVar1 = lVar4 < (int)((uint)this->m_len - iVar6);
      lVar4 = lVar4 + 1;
    } while (bVar1);
  }
  return -1;
}

Assistant:

int dynamic_string::find_left(const char* p, bool case_sensitive) const
    {
        CRNLIB_ASSERT(p);

        const int p_len = (int)strlen(p);

        for (int i = 0; i <= (m_len - p_len); i++)
        {
            if ((case_sensitive ? strncmp : _strnicmp)(p, &m_pStr[i], p_len) == 0)
            {
                return i;
            }
        }

        return -1;
    }